

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzDD::ArchiveIN(ChNodeFEAxyzDD *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChNodeFEAxyzDD *)(this[-1].DD_dtdt.m_data + 2),in_RSI);
  return;
}

Assistant:

void ChNodeFEAxyzDD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzDD>();
    // deserialize parent class
    ChNodeFEAxyzD::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(DD);
    marchive >> CHNVP(DD_dt);
    marchive >> CHNVP(DD_dtdt);
}